

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O1

bool djgt_to_gl(djg_texture *texture,GLint target,GLint internalformat,bool immutable,bool mipmap,
               GLuint *gl)

{
  int iVar1;
  bool bVar2;
  GLboolean GVar3;
  GLenum GVar4;
  int iVar5;
  GLenum GVar6;
  djg_texture *pdVar7;
  ulong uVar8;
  ulong uVar9;
  djg_texture *pdVar10;
  uint uVar11;
  GLsizei GVar12;
  size_t __size;
  uint uVar13;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  char *__ptr;
  djg_texture *it_1;
  bool bVar19;
  GLuint glt;
  GLint local_88 [12];
  djgt__glpss pus;
  int iVar14;
  
  if ((texture == (djg_texture *)0x0) || (gl == (GLuint *)0x0)) {
    __assert_fail("texture && gl",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_opengl/dj_opengl.h"
                  ,0x46f,"bool djgt_to_gl(const djg_texture *, GLint, GLint, bool, bool, GLuint *)")
    ;
  }
  (*glad_glGetError)();
  do {
    GVar4 = (*glad_glGetError)();
  } while (GVar4 != 0);
  iVar5 = 1;
  pdVar7 = texture;
  do {
    pdVar7 = pdVar7->next;
    iVar5 = iVar5 + -1;
  } while (pdVar7 != (djg_texture *)0x0);
  if (iVar5 == 0) {
    return false;
  }
  (*glad_glGenTextures)(1,&glt);
  (*glad_glBindTexture)(target,glt);
  if (target < 0x84f7) {
    if (target < 0x8064) {
      if (target != 0xde0) {
        if (target == 0xde1) goto LAB_001662ef;
        if (target != 0x8063) goto LAB_00166645;
      }
      iVar5 = texture->next->x;
      if (immutable) {
        iVar14 = 0;
        if (0 < iVar5) {
          iVar14 = iVar5;
        }
        uVar13 = iVar14 - 1;
        uVar8 = 1;
        do {
          uVar13 = (int)uVar13 >> ((byte)uVar8 & 0x1f) | uVar13;
          bVar19 = uVar8 < 0x10;
          uVar8 = uVar8 * 2;
        } while (bVar19);
        GVar12 = 0;
        if ((uVar13 & 1) != 0) {
          GVar12 = 0;
          uVar13 = uVar13 + 1;
          do {
            GVar12 = GVar12 + 1;
            uVar17 = uVar13 & 2;
            uVar13 = (int)uVar13 >> 1;
          } while (uVar17 == 0);
        }
        (*glad_glTexStorage1D)(target,GVar12,internalformat,iVar5);
      }
      else {
        (*glad_glTexImage1D)(target,0,internalformat,iVar5,0,0x1903,0x1401,(void *)0x0);
      }
      pdVar7 = texture->next;
      pus[4] = 0;
      pus[5] = 0;
      pus[6] = 0;
      pus[7] = 0;
      pus[0] = 0;
      pus[1] = 0;
      pus[2] = 0;
      pus[3] = 0;
      pus[8] = 2;
      djgt__get_glpus(local_88);
      iVar5 = bcmp(pus,local_88,0x24);
      if (iVar5 != 0) {
        djgt__set_glpus(pus);
      }
      uVar13 = pdVar7->comp - 1;
      GVar6 = 0x500;
      GVar4 = 0x500;
      if (uVar13 < 4) {
        GVar4 = *(GLenum *)(&DAT_001aa950 + (ulong)uVar13 * 4);
      }
      uVar13 = pdVar7->pf - 1;
      if (uVar13 < 4) {
        GVar6 = *(GLenum *)(&DAT_001aa960 + (ulong)uVar13 * 4);
      }
      (*glad_glTexSubImage1D)(target,0,0,pdVar7->x,GVar4,GVar6,pdVar7->texels);
      if (iVar5 != 0) {
        djgt__set_glpus(local_88);
      }
      (*glad_glGetError)();
      do {
        GVar4 = (*glad_glGetError)();
      } while (GVar4 != 0);
      bVar19 = true;
    }
    else if (target - 0x806fU < 2) {
      pdVar7 = texture->next;
      uVar13 = pdVar7->x;
      uVar17 = pdVar7->y;
      uVar8 = (ulong)uVar17;
      uVar11 = 0xffffffff;
      do {
        texture = texture->next;
        uVar11 = uVar11 + 1;
      } while (texture != (djg_texture *)0x0);
      if (immutable) {
        uVar18 = uVar17;
        if ((int)uVar17 < (int)uVar13) {
          uVar18 = uVar13;
        }
        if ((int)uVar18 <= (int)uVar11) {
          uVar18 = uVar11;
        }
        uVar18 = uVar18 - 1;
        uVar9 = 1;
        do {
          uVar18 = (int)uVar18 >> ((byte)uVar9 & 0x1f) | uVar18;
          bVar19 = uVar9 < 0x10;
          uVar9 = uVar9 * 2;
        } while (bVar19);
        GVar12 = 0;
        if ((uVar18 & 1) != 0) {
          GVar12 = 0;
          uVar18 = uVar18 + 1;
          do {
            GVar12 = GVar12 + 1;
            uVar16 = uVar18 & 2;
            uVar18 = (int)uVar18 >> 1;
          } while (uVar16 == 0);
        }
        uVar9 = (ulong)uVar13;
        (*glad_glTexStorage3D)(target,GVar12,internalformat,uVar13,uVar17,uVar11);
      }
      else {
        uVar9 = (ulong)uVar13;
        (*glad_glTexImage3D)
                  (target,0,internalformat,uVar13,uVar17,uVar11,0,0x1903,0x1401,(void *)0x0);
      }
      if (uVar11 == 0) {
        bVar19 = true;
      }
      else {
        uVar13 = 1;
        do {
          bVar19 = djgt__glTexSubImage3D(pdVar7,target,uVar11,(GLint)uVar9,(GLint)uVar8);
          if (uVar11 <= uVar13) break;
          pdVar7 = pdVar7->next;
          uVar13 = uVar13 + 1;
        } while (bVar19);
      }
    }
    else {
      if ((target != 0x8064) && (target != 0x84f5)) goto LAB_00166645;
LAB_001662ef:
      iVar5 = texture->next->x;
      iVar14 = texture->next->y;
      if (immutable) {
        iVar1 = iVar14;
        if (iVar14 < iVar5) {
          iVar1 = iVar5;
        }
        iVar15 = 0;
        if (0 < iVar1) {
          iVar15 = iVar1;
        }
        uVar13 = iVar15 - 1;
        uVar8 = 1;
        do {
          uVar13 = (int)uVar13 >> ((byte)uVar8 & 0x1f) | uVar13;
          bVar19 = uVar8 < 0x10;
          uVar8 = uVar8 * 2;
        } while (bVar19);
        GVar12 = 0;
        if ((uVar13 & 1) != 0) {
          GVar12 = 0;
          uVar13 = uVar13 + 1;
          do {
            GVar12 = GVar12 + 1;
            uVar17 = uVar13 & 2;
            uVar13 = (int)uVar13 >> 1;
          } while (uVar17 == 0);
        }
        (*glad_glTexStorage2D)(target,GVar12,internalformat,iVar5,iVar14);
      }
      else {
        (*glad_glTexImage2D)(target,0,internalformat,iVar5,iVar14,0,0x1903,0x1401,(void *)0x0);
      }
      bVar19 = djgt__glTexSubImage2D(texture->next,target,0,iVar5);
    }
  }
  else if (target < 0x8c1a) {
    if (target - 0x8c18U < 2) {
      pdVar7 = texture->next;
      uVar13 = pdVar7->x;
      if (immutable) {
        uVar17 = 0;
        if (0 < (int)uVar13) {
          uVar17 = uVar13;
        }
        uVar17 = uVar17 - 1;
        uVar8 = 1;
        do {
          uVar17 = (int)uVar17 >> ((byte)uVar8 & 0x1f) | uVar17;
          bVar19 = uVar8 < 0x10;
          uVar8 = uVar8 * 2;
        } while (bVar19);
        GVar12 = 0;
        if ((uVar17 & 1) != 0) {
          GVar12 = 0;
          uVar17 = uVar17 + 1;
          do {
            GVar12 = GVar12 + 1;
            uVar11 = uVar17 & 2;
            uVar17 = (int)uVar17 >> 1;
          } while (uVar11 == 0);
        }
        iVar5 = -1;
        pdVar10 = texture;
        do {
          pdVar10 = pdVar10->next;
          iVar5 = iVar5 + 1;
        } while (pdVar10 != (djg_texture *)0x0);
        uVar8 = (ulong)uVar13;
        (*glad_glTexStorage2D)(target,GVar12,internalformat,uVar13,iVar5);
      }
      else {
        iVar5 = -1;
        pdVar10 = texture;
        do {
          pdVar10 = pdVar10->next;
          iVar5 = iVar5 + 1;
        } while (pdVar10 != (djg_texture *)0x0);
        uVar8 = (ulong)uVar13;
        (*glad_glTexImage2D)(target,0,internalformat,uVar13,iVar5,0,0x1903,0x1401,(void *)0x0);
      }
      if (pdVar7 == (djg_texture *)0x0) {
        bVar19 = true;
      }
      else {
        iVar5 = 0;
        bVar19 = true;
        do {
          pdVar7 = pdVar7->next;
          bVar2 = djgt__glTexSubImage2D(texture->next,target,iVar5,(GLint)uVar8);
          bVar19 = (bool)(bVar19 & bVar2);
          iVar5 = iVar5 + 1;
        } while (pdVar7 != (djg_texture *)0x0);
      }
    }
    else {
      if (target == 0x84f7) goto LAB_001662ef;
      if (target != 0x8513) goto LAB_00166645;
      pdVar7 = texture->next;
      uVar13 = pdVar7->x;
      uVar17 = pdVar7->y;
      if (immutable) {
        uVar11 = uVar17;
        if ((int)uVar17 < (int)uVar13) {
          uVar11 = uVar13;
        }
        uVar18 = 0;
        if (0 < (int)uVar11) {
          uVar18 = uVar11;
        }
        uVar18 = uVar18 - 1;
        uVar8 = 1;
        do {
          uVar18 = (int)uVar18 >> ((byte)uVar8 & 0x1f) | uVar18;
          bVar19 = uVar8 < 0x10;
          uVar8 = uVar8 * 2;
        } while (bVar19);
        GVar12 = 0;
        if ((uVar18 & 1) != 0) {
          GVar12 = 0;
          uVar11 = uVar18 + 1;
          do {
            GVar12 = GVar12 + 1;
            uVar18 = uVar11 & 2;
            uVar11 = (int)uVar11 >> 1;
          } while (uVar18 == 0);
        }
        uVar8 = (ulong)uVar13;
        (*glad_glTexStorage2D)(0x8513,GVar12,internalformat,uVar13,uVar17);
      }
      else {
        GVar4 = 0x8515;
        do {
          uVar8 = (ulong)uVar13;
          (*glad_glTexImage2D)(GVar4,0,internalformat,uVar13,uVar17,0,0x1903,0x1401,(void *)0x0);
          GVar4 = GVar4 + 1;
        } while (GVar4 != 0x851b);
      }
      if (pdVar7 == (djg_texture *)0x0) goto LAB_00166835;
      uVar13 = 0;
      bVar19 = true;
      do {
        if ((bVar19 == false) ||
           (bVar19 = djgt__glTexSubImage2D(pdVar7,uVar13 + 0x8515,0,(GLint)uVar8), 4 < uVar13))
        break;
        pdVar7 = pdVar7->next;
        uVar13 = uVar13 + 1;
      } while (pdVar7 != (djg_texture *)0x0);
    }
  }
  else {
    if (1 < target - 0x8c1aU) {
LAB_00166645:
      __ptr = "djg_error: Unsupported GL texture target\n";
      __size = 0x29;
      goto LAB_001668b3;
    }
    pdVar7 = texture->next;
    uVar13 = pdVar7->x;
    uVar17 = pdVar7->y;
    uVar8 = (ulong)uVar17;
    iVar5 = 1;
    do {
      texture = texture->next;
      iVar5 = iVar5 + -1;
    } while (texture != (djg_texture *)0x0);
    uVar11 = -iVar5;
    if (immutable) {
      uVar18 = uVar17;
      if ((int)uVar17 < (int)uVar13) {
        uVar18 = uVar13;
      }
      uVar16 = 0;
      if (0 < (int)uVar18) {
        uVar16 = uVar18;
      }
      uVar16 = uVar16 - 1;
      uVar9 = 1;
      do {
        uVar16 = (int)uVar16 >> ((byte)uVar9 & 0x1f) | uVar16;
        bVar19 = uVar9 < 0x10;
        uVar9 = uVar9 * 2;
      } while (bVar19);
      GVar12 = 0;
      if ((uVar16 & 1) != 0) {
        GVar12 = 0;
        uVar18 = uVar16 + 1;
        do {
          GVar12 = GVar12 + 1;
          uVar16 = uVar18 & 2;
          uVar18 = (int)uVar18 >> 1;
        } while (uVar16 == 0);
      }
      uVar9 = (ulong)uVar13;
      (*glad_glTexStorage3D)(target,GVar12,internalformat,uVar13,uVar17,uVar11);
    }
    else {
      uVar9 = (ulong)uVar13;
      (*glad_glTexImage3D)(target,0,internalformat,uVar13,uVar17,uVar11,0,0x1903,0x1401,(void *)0x0)
      ;
    }
    if (iVar5 == 0) {
LAB_00166835:
      bVar19 = true;
    }
    else {
      uVar13 = 0;
      do {
        bVar19 = djgt__glTexSubImage3D(pdVar7,target,uVar13,(GLint)uVar9,(GLint)uVar8);
        uVar13 = uVar13 + 1;
        if (uVar11 <= uVar13) break;
        pdVar7 = pdVar7->next;
      } while (bVar19);
    }
  }
  if ((mipmap) && (bVar19 != false)) {
    (*glad_glGenerateMipmap)(target);
  }
  GVar4 = (*glad_glGetError)();
  do {
    GVar6 = (*glad_glGetError)();
  } while (GVar6 != 0);
  if ((GVar4 == 0) && (bVar19 != false)) {
    GVar3 = (*glad_glIsTexture)(*gl);
    if (GVar3 != '\0') {
      (*glad_glDeleteTextures)(1,gl);
    }
    *gl = glt;
    return true;
  }
  __ptr = "djg_error: Caught OpenGL error\n";
  __size = 0x1f;
LAB_001668b3:
  fwrite(__ptr,__size,1,_stdout);
  fflush(_stdout);
  return false;
}

Assistant:

DJGDEF bool
djgt_to_gl(
    const djg_texture *texture,
    GLint target,
    GLint internalformat,
    bool immutable,
    bool mipmap,
    GLuint *gl
) {
    bool v = true;
    GLuint glt;

    DJG_ASSERT(texture && gl);
    djgt__validate(); // flush previous OpenGL errors

    if (!djgt__count(texture)) return false;
    glGenTextures(1, &glt);
    glBindTexture(target, glt);
    switch (target) {
        /*************************************************************/
        /***/
        /***/
        // 1D
        case GL_TEXTURE_1D:
        case GL_PROXY_TEXTURE_1D: {
            int x = texture->next->x;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage1D(target,
                               djgt__mipcnt(x, 0, 0),
                               internalformat,
                               x);
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage1D(target,
                    /*level*/0,
                             internalformat,
                             x,
                   /*border*/0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            djgt__glTexSubImage1D(texture->next, target, /*xoffset*/0);
        } break;

        /*************************************************************/
        /***/
        /***/
        // 1D_ARRAY
        case GL_TEXTURE_1D_ARRAY:
        case GL_PROXY_TEXTURE_1D_ARRAY: {
            int x = texture->next->x;
            int i = 0;
            const djg_texture *it = texture->next;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage2D(target,
                               djgt__mipcnt(x, 0, 0),
                               internalformat,
                               x,
                               djgt__count(texture));
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage2D(target,
                    /*level*/0,
                             internalformat,
                             x,
                             djgt__count(texture),
                   /*border*/0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            while (it) {
                it = it->next;
                v&= djgt__glTexSubImage2D(texture->next,
                                          target,
                               /*offsets*/0, i);
                ++i;
            }
        } break;

        /*************************************************************/
        /***/
        /***/
        // 2D
        case GL_TEXTURE_2D:
        case GL_TEXTURE_RECTANGLE:
        case GL_PROXY_TEXTURE_2D:
        case GL_PROXY_TEXTURE_RECTANGLE: {
            int x = texture->next->x;
            int y = texture->next->y;
#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage2D(target,
                               djgt__mipcnt(x, y, 0),
                               internalformat,
                               x,
                               y);
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage2D(target,
                    /*level*/0,
                             internalformat,
                             x,
                             y,
                   /*border*/0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            v&= djgt__glTexSubImage2D(texture->next, target, /*offsets*/0, 0);
        } break;

        /*************************************************************/
        /***/
        /***/
        // CUBEMAP
        case GL_TEXTURE_CUBE_MAP: {
            int x = texture->next->x;
            int y = texture->next->y;
            const djg_texture *it = texture->next;
            int i;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage2D(target,
                               djgt__mipcnt(x, y, 0),
                               internalformat,
                               x,
                               y);
            } else
#endif // NGL_ARB_texture_storage
            {
                for (i = 0; i < 6; ++i)
                    glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i,
                                 0, internalformat, x, y, 0,
                        /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            for (i = 0; i < 6 && it && v; ++i) {
                v&= djgt__glTexSubImage2D(it,
                                          GL_TEXTURE_CUBE_MAP_POSITIVE_X + i,
                               /*offsets*/0, 0);
                it = it->next;
            }
        } break;

        /*************************************************************/
        /***/
        /***/
        // 2D_ARRAY
        case GL_TEXTURE_2D_ARRAY:
        case GL_PROXY_TEXTURE_2D_ARRAY: {
            int x = texture->next->x;
            int y = texture->next->y;
            int z = djgt__count(texture);
            const djg_texture *it = texture->next;
            int i;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage3D(target,
                               djgt__mipcnt(x, y, 0),
                               internalformat,
                               x,
                               y,
                               z);
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage3D(target, 0, internalformat, x, y, z, 0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            for (i = 0; i < z && v; ++i) {
                v&= djgt__glTexSubImage3D(it,
                                          target,
                               /*offsets*/0, 0, i);
                it = it->next;
            }
        } break;

        /*************************************************************/
        /***/
        /***/
        // 3D
        case GL_TEXTURE_3D:
        case GL_PROXY_TEXTURE_3D: {
            int x = texture->next->x;
            int y = texture->next->y;
            int z = djgt__count(texture);
            const djg_texture *it = texture->next;
            int i;

#ifndef NGL_ARB_texture_storage
            if (immutable) {
                glTexStorage3D(target,
                               djgt__mipcnt(x, y, z),
                               internalformat,
                               x,
                               y,
                               z);
            } else
#endif // NGL_ARB_texture_storage
            {
                glTexImage3D(target, 0, internalformat, x, y, z, 0,
                    /*dummy*/GL_RED, GL_UNSIGNED_BYTE, NULL);
            }
            for (i = 0; i < z && v; ++i) {
                v&= djgt__glTexSubImage3D(it,
                                          target,
                               /*offsets*/0, 0, z);
                it = it->next;
            }
        } break;

        /*************************************************************/
        /***/
        /***/
        // Error
        default:
            DJG_LOG("djg_error: Unsupported GL texture target\n");

            return false;
            break;
    }

    if (mipmap && v) glGenerateMipmap(target);

    if (!(v&= djgt__validate())) {
        DJG_LOG("djg_error: Caught OpenGL error\n");

        return false;
    }

    if (glIsTexture(*gl)) glDeleteTextures(1, gl);
    *gl = glt;

    return true;
}